

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
  **__return_storage_ptr__;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_00;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  custom;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  custom_00;
  type arg_type;
  char *pcVar3;
  longdouble in_stack_fffffffffffffbf8;
  undefined6 in_stack_fffffffffffffc02;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_350;
  buffer<char> *local_320;
  specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  local_318;
  undefined1 local_300 [8];
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  f;
  format_arg arg;
  char *end_local;
  char *begin_local;
  int id_local;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *this_local;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  local_258;
  basic_string_view<char> local_248 [3];
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> **local_210;
  char *local_208;
  bool local_1f9;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  local_1e8;
  basic_string_view<char> local_1d8 [3];
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> **local_1a0;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_198;
  iterator local_190;
  buffer<char> *local_180;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_170;
  buffer<char> *local_168;
  buffer<char> *local_158;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_148;
  buffer<char> *local_140;
  buffer<char> *local_130;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_120;
  buffer<char> *local_118;
  buffer<char> *local_108;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_f8;
  buffer<char> *local_f0;
  buffer<char> *local_d0;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_a0;
  buffer<char> *local_80;
  buffer<char> *local_60;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_30;
  buffer<char> *local_10;
  
  pcVar3 = end;
  advance_to<char,fmt::v7::detail::error_handler>(&this->parse_context,begin);
  __return_storage_ptr__ = &f.ctx_;
  get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
            ((format_arg *)__return_storage_ptr__,(detail *)&this->context,
             (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)(ulong)(uint)id,(int)pcVar3);
  pcVar3 = &specs.type;
  custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::custom_formatter((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)pcVar3,&this->parse_context,&this->context);
  local_210 = __return_storage_ptr__;
  local_208 = pcVar3;
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 0:
  default:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3);
    break;
  case 1:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(int)f.ctx_._0_4_);
    break;
  case 2:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(uint)f.ctx_._0_4_);
    break;
  case 3:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    break;
  case 4:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    break;
  case 5:
    auVar1._10_6_ = in_stack_fffffffffffffc02;
    auVar1._0_10_ = in_stack_fffffffffffffbf8;
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(__int128)auVar1);
    break;
  case 6:
    auVar2._10_6_ = in_stack_fffffffffffffc02;
    auVar2._0_10_ = in_stack_fffffffffffffbf8;
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(unsigned___int128)auVar2);
    break;
  case 7:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(bool)((byte)f.ctx_ & 1));
    break;
  case 8:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(byte)f.ctx_);
    break;
  case 9:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,f.ctx_._0_4_);
    break;
  case 10:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(double)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    break;
  case 0xb:
    in_stack_fffffffffffffbf8 =
         (longdouble)
         CONCAT28(arg.value_.field_0.int_value._0_2_,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,in_stack_fffffffffffffbf8);
    break;
  case 0xc:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(char *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (local_248,(char *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_),
               CONCAT62(arg.value_.field_0.long_long_value._2_6_,arg.value_.field_0.int_value._0_2_)
              );
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,local_248[0]);
    break;
  case 0xe:
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                              *)pcVar3,(void *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
    break;
  case 0xf:
    custom.value._4_4_ = f.ctx_._4_4_;
    custom.value._0_4_ = f.ctx_._0_4_;
    custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
    custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
    basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::handle::handle((handle *)&local_258,custom);
    local_1f9 = custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                ::operator()((custom_formatter<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                              *)pcVar3,(handle)local_258);
  }
  if (local_1f9 == false) {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)&handler.checker_.arg_type_);
    specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::specs_handler(&local_318,(basic_format_specs<char> *)&handler.checker_.arg_type_,
                    &this->parse_context,&this->context);
    arg_type = basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               ::type((basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)&f.ctx_);
    specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                     *)local_300,&local_318,arg_type);
    this_local = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *)parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                              (begin,end,
                               (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                                *)local_300);
    if ((this_local ==
         (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          *)end) || (*(char *)this_local != '}')) {
      error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
    }
    advance_to<char,fmt::v7::detail::error_handler>(&this->parse_context,(char *)this_local);
    arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::arg_formatter
              (&local_350,&this->context,&this->parse_context,
               (format_specs *)&handler.checker_.arg_type_,(char *)0x0);
    local_1a0 = &f.ctx_;
    local_198 = &local_350;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 0:
    default:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                       );
      break;
    case 1:
      local_170 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        local_180 = (buffer<char> *)
                    write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                              (local_350.
                               super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                               .out_.container,(int)f.ctx_._0_4_);
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_180;
      }
      else {
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<int>(&local_350.
                          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                         ,(int)f.ctx_._0_4_,
                         local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                         .specs_);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_168 = local_190.container;
      break;
    case 2:
      local_148 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        local_158 = (buffer<char> *)
                    write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                              (local_350.
                               super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                               .out_.container,(uint)f.ctx_._0_4_);
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_158;
      }
      else {
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_int>
                  (&local_350.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,(uint)f.ctx_._0_4_,
                   local_350.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .specs_);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_140 = local_190.container;
      break;
    case 3:
      local_120 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        local_130 = (buffer<char> *)
                    write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                              (local_350.
                               super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                               .out_.container,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_130;
      }
      else {
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<long_long>
                  (&local_350.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_),
                   local_350.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .specs_);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_118 = local_190.container;
      break;
    case 4:
      local_f8 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        local_108 = (buffer<char> *)
                    write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                              (local_350.
                               super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                               .out_.container,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_108;
      }
      else {
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_long_long>
                  (&local_350.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_),
                   local_350.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .specs_);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_f0 = local_190.container;
      break;
    case 5:
      out.container._4_4_ = f.ctx_._4_4_;
      out.container._0_4_ = f.ctx_._0_4_;
      local_a0 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        value_00._10_6_ = in_stack_fffffffffffffc02;
        value_00._0_10_ = in_stack_fffffffffffffbf8;
        local_d0 = (buffer<char> *)
                   write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                             (local_350.
                              super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                              .out_.container,out,(__int128)value_00);
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_d0;
      }
      else {
        value._10_6_ = in_stack_fffffffffffffc02;
        value._0_10_ = in_stack_fffffffffffffbf8;
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<__int128>
                  (&local_350.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,(__int128)value,(format_specs *)out.container);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_80 = local_190.container;
      break;
    case 6:
      out_00.container._4_4_ = f.ctx_._4_4_;
      out_00.container._0_4_ = f.ctx_._0_4_;
      local_30 = &local_350;
      if (local_350.
          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
          .specs_ == (format_specs *)0x0) {
        value_02._10_6_ = in_stack_fffffffffffffc02;
        value_02._0_10_ = in_stack_fffffffffffffbf8;
        local_60 = (buffer<char> *)
                   write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                             (local_350.
                              super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                              .out_.container,out_00,(unsigned___int128)value_02);
        local_350.
        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        .out_.container = local_60;
      }
      else {
        value_01._10_6_ = in_stack_fffffffffffffc02;
        value_01._0_10_ = in_stack_fffffffffffffbf8;
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
        ::write_int<unsigned__int128>
                  ((arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
                    *)&local_350,(unsigned___int128)value_01,(format_specs *)out_00.container);
      }
      local_190.container =
           local_350.
           super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           .out_.container;
      local_10 = local_190.container;
      break;
    case 7:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                        ,(bool)((byte)f.ctx_ & 1));
      break;
    case 8:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                        ,(byte)f.ctx_);
      break;
    case 9:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()<float,_0>
                     (&local_350.
                       super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                      ,f.ctx_._0_4_);
      break;
    case 10:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()<double,_0>
                     (&local_350.
                       super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                      ,(double)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
      break;
    case 0xb:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()<long_double,_0>
                     (&local_350.
                       super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                      ,(longdouble)
                       CONCAT28(arg.value_.field_0.int_value._0_2_,
                                CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_)));
      break;
    case 0xc:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                        ,(char *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
      break;
    case 0xd:
      basic_string_view<char>::basic_string_view
                (local_1d8,(char *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_),
                 CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                          arg.value_.field_0.int_value._0_2_));
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                        ,local_1d8[0]);
      break;
    case 0xe:
      local_190.container =
           (buffer<char> *)
           arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
           ::operator()(&local_350.
                         super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                        ,(void *)CONCAT44(f.ctx_._4_4_,f.ctx_._0_4_));
      break;
    case 0xf:
      custom_00.value._4_4_ = f.ctx_._4_4_;
      custom_00.value._0_4_ = f.ctx_._0_4_;
      custom_00.format._0_2_ = arg.value_.field_0.int_value._0_2_;
      custom_00.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::handle::handle((handle *)&local_1e8,custom_00);
      local_190.container =
           (buffer<char> *)
           arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
           operator()(&local_350,(handle)local_1e8);
    }
    local_320 = local_190.container;
    basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
    advance_to(&this->context,local_190);
  }
  else {
    this_local = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *)basic_format_parse_context<char,_fmt::v7::detail::error_handler>::begin
                              (&this->parse_context);
  }
  return (char *)this_local;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    auto arg = get_arg(context, id);
    custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using parse_context_t = basic_format_parse_context<Char>;
    specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }